

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

int __thiscall imrt::Collimator::searchReferenceIndex(Collimator *this,pair<int,_int> p)

{
  mapped_type *pmVar1;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000024;
  int local_1c;
  int local_c;
  int iStack_8;
  
  local_1c = 0;
  do {
    if (*(int *)(in_RDI + 0x1b0) <= local_1c) {
      return -1;
    }
    pmVar1 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                           *)CONCAT44(in_stack_00000024,p.second),
                          (key_type_conflict *)CONCAT44(p.first,in_stack_00000018));
    local_c = (int)in_RSI;
    if (pmVar1->first == local_c) {
      pmVar1 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                             *)CONCAT44(in_stack_00000024,p.second),
                            (key_type_conflict *)CONCAT44(p.first,in_stack_00000018));
      iStack_8 = (int)((ulong)in_RSI >> 0x20);
      if (pmVar1->second == iStack_8) {
        return local_1c;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int Collimator::searchReferenceIndex (pair<int, int> p) {
    for (int i=0;i<ref_size;i++) {
      if (reference[i].first == p.first && reference[i].second==p.second)
        return(i);
    }
    return(-1);
  }